

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Stress::LongShaderTests::init(LongShaderTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext **rnd;
  uint uVar1;
  pointer pcVar2;
  deUint32 dVar3;
  _Alloc_hider str;
  int in_EAX;
  ShaderType shaderType;
  deUint32 dVar4;
  char *pcVar5;
  TestCase *this_00;
  uint uVar6;
  double dVar7;
  deUint32 opCount;
  allocator<char> local_121;
  uint local_120;
  deUint32 local_11c;
  ulong local_118;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  for (local_118 = 0; local_118 != 4; local_118 = local_118 + 1) {
    local_11c = (&DAT_018813b0)[local_118];
    local_120 = (uint)(local_118 < 2);
    shaderType = SHADERTYPE_VERTEX;
    while( true ) {
      if (shaderType == SHADERTYPE_GEOMETRY) break;
      opCount = local_11c;
      de::toString<unsigned_int>(&local_110,&opCount);
      std::operator+(&desc,&local_110,"_operations_");
      pcVar5 = glu::getShaderTypeName(shaderType);
      std::operator+(&name,&desc,pcVar5);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Compile ",&local_121);
      pcVar5 = glu::getShaderTypeName(shaderType);
      std::operator+(&local_70,&local_b0,pcVar5);
      std::operator+(&local_f0,&local_70," shader with ");
      de::toString<unsigned_int>(&local_50,&opCount);
      std::operator+(&local_110,&local_f0,&local_50);
      std::operator+(&desc,&local_110," operations");
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
      dVar3 = opCount;
      dVar7 = floor(SQRT((double)opCount));
      uVar1 = (uint)(long)dVar7;
      if ((uint)(long)dVar7 < 0xb) {
        uVar1 = 10;
      }
      uVar6 = uVar1 >> 1;
      if (9 < uVar1 >> 1) {
        uVar6 = 10;
      }
      this_00 = (TestCase *)operator_new(0x120);
      str = name._M_dataplus;
      gles3::TestCase::TestCase
                (this_00,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 desc._M_dataplus._M_p);
      (this_00->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__LongShaderCompileStressCase_01e4c760;
      *(ShaderType *)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode = shaderType;
      *(uint *)((long)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = local_120;
      dVar4 = deStringHash(str._M_p);
      rnd = &this_00[1].super_TestCase.super_TestNode.m_testCtx;
      deRandom_init((deRandom *)rnd,dVar4 ^ 0xac9c91d);
      pcVar2 = this_00[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p;
      this_00[1].super_TestCase.super_TestNode.m_name._M_string_length = (size_type)*rnd;
      this_00[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
           (size_type)pcVar2;
      *(ShaderType *)((long)&this_00[1].super_TestCase.super_TestNode.m_name.field_2 + 8) =
           shaderType;
      *(deUint32 *)((long)&this_00[1].super_TestCase.super_TestNode.m_name.field_2 + 0xc) = dVar3;
      *(uint *)&this_00[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = uVar1;
      *(uint *)((long)&this_00[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4)
           = uVar6;
      local_110._M_dataplus._M_p._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 &this_00[1].super_TestCase.super_TestNode.m_description._M_string_length,1,
                 (value_type_conflict1 *)&local_110,(allocator_type *)&local_f0);
      this_00[1].super_TestCase.super_TestNode.m_nodeType = NODETYPE_PACKAGE;
      *(undefined8 *)&this_00[1].super_TestCase.super_TestNode.field_0x54 = 0;
      *(undefined8 *)
       ((long)&this_00[1].super_TestCase.super_TestNode.m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_start + 4) = 0;
      *(undefined8 *)
       ((long)&this_00[1].super_TestCase.super_TestNode.m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined8 *)
       ((long)&this_00[1].super_TestCase.super_TestNode.m_children.
               super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      *(undefined8 *)((long)&this_00[1].m_context + 4) = 0;
      *(undefined8 *)((long)&this_00[2].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
      *(undefined4 *)((long)&this_00[2].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
      this_00[2].super_TestCase.super_TestNode.m_name._M_dataplus._M_p =
           (pointer)&this_00[2].super_TestCase.super_TestNode.m_name.field_2;
      this_00[2].super_TestCase.super_TestNode.m_name._M_string_length = 0;
      this_00[2].super_TestCase.super_TestNode.m_name.field_2._M_local_buf[0] = '\0';
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&name);
      shaderType = shaderType + SHADERTYPE_FRAGMENT;
    }
    in_EAX = 2;
  }
  return in_EAX;
}

Assistant:

void LongShaderTests::init (void)
{
	const deUint32	requireLinkOkMaxOps	= 1000;

	const deUint32	caseOpCounts[] =
	{
		100,
		1000,
		10000,
		100000
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(caseOpCounts); caseNdx++)
	{
		for (int shaderTypeInt = 0; shaderTypeInt < 2; shaderTypeInt++)
		{
			const glu::ShaderType	shaderType		= (shaderTypeInt == 0) ? glu::SHADERTYPE_VERTEX : glu::SHADERTYPE_FRAGMENT;
			const deUint32			opCount			= caseOpCounts[caseNdx];
			const deUint32			flags			= (opCount <= requireLinkOkMaxOps) ? CASE_REQUIRE_LINK_STATUS_OK : 0;

			const std::string		name			= de::toString(opCount) + "_operations_" + glu::getShaderTypeName(shaderType);
			const std::string		desc			= std::string("Compile ") + glu::getShaderTypeName(shaderType) + " shader with " + de::toString(opCount) + " operations";

			LongShaderSpec			caseSpec		(shaderType, opCount);

			addChild(new LongShaderCompileStressCase(m_context, name.c_str(), desc.c_str(), caseSpec, flags));
		}
	}
}